

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

void __thiscall QToolBoxButton::initStyleOption(QToolBoxButton *this,QStyleOptionToolBox *option)

{
  byte *pbVar1;
  State *pSVar2;
  qsizetype qVar3;
  QToolBox *this_00;
  long lVar4;
  long lVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (option != (QStyleOptionToolBox *)0x0) {
    QStyleOption::initFrom(&option->super_QStyleOption,(QWidget *)this);
    if (this->selected == true) {
      pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    bVar8 = QAbstractButton::isDown(&this->super_QAbstractButton);
    if (bVar8) {
      pSVar2 = &(option->super_QStyleOption).state;
      *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 4;
    }
    QAbstractButton::text((QString *)&local_38,&this->super_QAbstractButton);
    pDVar6 = (option->text).d.d;
    pcVar7 = (option->text).d.ptr;
    (option->text).d.d = local_38.d;
    (option->text).d.ptr = local_38.ptr;
    qVar3 = (option->text).d.size;
    (option->text).d.size = local_38.size;
    local_38.d = pDVar6;
    local_38.ptr = pcVar7;
    local_38.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QAbstractButton::icon((QAbstractButton *)&local_38);
    QIcon::operator=(&option->icon,(QIcon *)&local_38);
    QIcon::~QIcon((QIcon *)&local_38);
    this_00 = *(QToolBox **)(*(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8 + 0x10)
    ;
    lVar4 = *(long *)&(this_00->super_QFrame).super_QWidget.field_0x8;
    lVar5 = *(long *)(lVar4 + 0x280);
    lVar4 = *(long *)(lVar4 + 0x278);
    iVar9 = QToolBox::currentIndex(this_00);
    iVar11 = (int)((ulong)(lVar5 - lVar4) >> 3);
    if (iVar11 == 1) {
      option->position = OnlyOneTab;
      iVar10 = this->indexInPage;
    }
    else {
      iVar10 = this->indexInPage;
      if (iVar10 == 0) {
        option->position = Beginning;
        iVar10 = 0;
      }
      else if (iVar10 == iVar11 + -1) {
        option->position = End;
      }
      else {
        option->position = Middle;
      }
    }
    if (iVar9 == iVar10 + -1) {
      option->selectedPosition = PreviousIsSelected;
    }
    else if (iVar9 == iVar10 + 1) {
      option->selectedPosition = NextIsSelected;
    }
    else {
      option->selectedPosition = NotAdjacent;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBoxButton::initStyleOption(QStyleOptionToolBox *option) const
{
    if (!option)
        return;
    option->initFrom(this);
    if (selected)
        option->state |= QStyle::State_Selected;
    if (isDown())
        option->state |= QStyle::State_Sunken;
    option->text = text();
    option->icon = icon();

    QToolBox *toolBox = static_cast<QToolBox *>(parentWidget()); // I know I'm in a tool box.
    const int widgetCount = toolBox->count();
    const int currIndex = toolBox->currentIndex();
    if (widgetCount == 1) {
        option->position = QStyleOptionToolBox::OnlyOneTab;
    } else if (indexInPage == 0) {
        option->position = QStyleOptionToolBox::Beginning;
    } else if (indexInPage == widgetCount - 1) {
        option->position = QStyleOptionToolBox::End;
    } else {
        option->position = QStyleOptionToolBox::Middle;
    }
    if (currIndex == indexInPage - 1) {
        option->selectedPosition = QStyleOptionToolBox::PreviousIsSelected;
    } else if (currIndex == indexInPage + 1) {
        option->selectedPosition = QStyleOptionToolBox::NextIsSelected;
    } else {
        option->selectedPosition = QStyleOptionToolBox::NotAdjacent;
    }
}